

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

void ggml::cpu::aarch64::gemm<block_q4_0,8l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  int m_1;
  long lVar18;
  long lVar19;
  int iVar20;
  float sumf [4] [4];
  long local_128;
  float *local_120;
  long local_118;
  float *local_108;
  uint local_78 [18];
  
  uVar16 = n / 0x20;
  lVar11 = (long)(int)uVar16;
  local_118 = (long)vy + 0x48;
  local_120 = s;
  for (uVar8 = 0; uVar8 != (uint)(~(nr / 4 >> 0x1f) & nr / 4); uVar8 = uVar8 + 1) {
    local_108 = local_120;
    local_128 = (long)vx + 8;
    for (uVar7 = 0; uVar7 != (uint)(~(nc / 4 >> 0x1f) & nc / 4); uVar7 = uVar7 + 1) {
      puVar3 = local_78;
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          puVar3[lVar9] = 0;
        }
        puVar3 = puVar3 + 4;
      }
      lVar4 = local_118;
      lVar9 = local_128;
      for (uVar5 = 0; uVar5 != (~((int)uVar16 >> 0x1f) & uVar16); uVar5 = uVar5 + 1) {
        lVar13 = lVar4;
        lVar19 = lVar9;
        for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
          lVar17 = lVar13;
          for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
            uVar1 = *(uint *)(&ggml_table_f32_f16 +
                             (ulong)*(ushort *)
                                     ((long)vy + lVar18 * 2 + uVar5 * 0x88 + uVar8 * lVar11 * 0x88)
                             * 4);
            lVar15 = lVar19;
            for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
              iVar20 = 0;
              for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
                iVar20 = iVar20 + ((int)((int)*(char *)(lVar17 + lVar14) *
                                         ((int)*(char *)(lVar15 + lVar14) & 0xfffffff0U) +
                                        (int)*(char *)(lVar17 + -0x40 + lVar14) *
                                        (int)(char)(*(char *)(lVar15 + lVar14) << 4)) >> 4);
              }
              lVar15 = lVar15 + 8;
              auVar2 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar20 *
                                                     *(float *)(&ggml_table_f32_f16 +
                                                               (ulong)*(ushort *)
                                                                       ((long)vx +
                                                                       lVar10 * 2 +
                                                                       uVar5 * 0x48 +
                                                                       uVar7 * lVar11 * 0x48) * 4)))
                                       ,ZEXT416(uVar1),ZEXT416(local_78[lVar18 * 4 + lVar10]));
              local_78[lVar18 * 4 + lVar10] = auVar2._0_4_;
            }
            lVar17 = lVar17 + 8;
          }
          lVar13 = lVar13 + 0x20;
          lVar19 = lVar19 + 0x20;
        }
        lVar4 = lVar4 + 0x88;
        lVar9 = lVar9 + 0x48;
      }
      puVar3 = local_78;
      pfVar6 = local_108;
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          pfVar6[lVar9] = (float)puVar3[lVar9];
        }
        pfVar6 = pfVar6 + bs;
        puVar3 = puVar3 + 4;
      }
      local_108 = local_108 + 4;
      local_128 = local_128 + lVar11 * 0x48;
    }
    local_118 = local_118 + lVar11 * 0x88;
    local_120 = local_120 + bs * 4;
  }
  return;
}

Assistant:

void gemm<block_q4_0, 8, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemm_q4_0_4x8_q8_0(n, s, bs, vx, vy, nr, nc);
}